

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_str.c
# Opt level: O2

int test_str(int argc,char **argv)

{
  int iVar1;
  CuString *summary;
  CuSuite *testSuite;
  CuTest *pCVar2;
  
  summary = CuStringNew();
  testSuite = CuSuiteNew();
  pCVar2 = CuTestNew("tc_ap_str_trim_head_from_set",tc_ap_str_trim_head_from_set);
  CuSuiteAdd(testSuite,pCVar2);
  pCVar2 = CuTestNew("tc_ap_str_trim_tail_from_set",tc_ap_str_trim_tail_from_set);
  CuSuiteAdd(testSuite,pCVar2);
  pCVar2 = CuTestNew("tc_ap_str_match",tc_ap_str_match);
  CuSuiteAdd(testSuite,pCVar2);
  CuSuiteRun(testSuite);
  CuSuiteSummary(testSuite,summary);
  CuSuiteDetails(testSuite,summary);
  puts(summary->buffer);
  iVar1 = testSuite->failCount;
  CuSuiteDelete(testSuite);
  CuStringDelete(summary);
  return iVar1;
}

Assistant:

int test_str (int argc, char *argv[])
{
	CuString	*output			= CuStringNew();
	CuSuite		*suite			= CuSuiteNew();
	int			failCount;

	AP_UNUSED_VAR (argc);
	AP_UNUSED_VAR (argv);

	SUITE_ADD_TEST (suite, tc_ap_str_trim_head_from_set);
	SUITE_ADD_TEST (suite, tc_ap_str_trim_tail_from_set);
	SUITE_ADD_TEST (suite, tc_ap_str_match);
	
	CuSuiteRun (suite);
	CuSuiteSummary (suite, output);
	CuSuiteDetails (suite, output);

	printf ("%s\n", output->buffer);

	failCount = suite->failCount;

	CuSuiteDelete (suite);
	CuStringDelete (output);

	return failCount;
}